

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::iterate
          (InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  char *local_268;
  string local_200;
  MessageBuilder local_1e0;
  int local_4c;
  undefined8 uStack_48;
  GLint compile_status;
  char *body_raw_ptr;
  string body;
  int current_iteration;
  bool result;
  Functions *gl;
  InvalidUseCasesForAllNotFuncsAndExclMarkOpTest *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar1);
  body.field_2._M_local_buf[0xf] = '\x01';
  GVar2 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x49d);
  for (body.field_2._8_4_ = 0; (int)body.field_2._8_4_ < 5;
      body.field_2._8_4_ = body.field_2._8_4_ + 1) {
    getShaderBody_abi_cxx11_((string *)&body_raw_ptr,this,body.field_2._8_4_);
    uStack_48 = std::__cxx11::string::c_str();
    local_4c = 0;
    (**(code **)(lVar5 + 0x12b8))(this->m_vs_id,1,&stack0xffffffffffffffb8,0);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glShaderSource() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x4aa);
    (**(code **)(lVar5 + 0x248))(this->m_vs_id);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x4ae);
    (**(code **)(lVar5 + 0xa70))(this->m_vs_id,0x8b81,&local_4c);
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                    ,0x4b1);
    if (local_4c == 1) {
      this_00 = tcu::TestContext::getLog
                          ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1e0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_1e0,
                          (char (*) [55])"The following vertex shader, used for test iteration [");
      getIterationName_abi_cxx11_(&local_200,this,body.field_2._8_4_);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_200);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(char (*) [66])
                                 "] was compiled successfully, even though it is invalid. Body:\n>>\n"
                         );
      pMVar6 = tcu::MessageBuilder::operator<<
                         (pMVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&body_raw_ptr);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [5])"\n<<\n");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_200);
      tcu::MessageBuilder::~MessageBuilder(&local_1e0);
      body.field_2._M_local_buf[0xf] = '\0';
    }
    std::__cxx11::string::~string((string *)&body_raw_ptr);
  }
  if ((body.field_2._M_local_buf[0xf] & 1U) == 0) {
    local_268 = "Fail";
  }
  else {
    local_268 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (uint)((body.field_2._M_local_buf[0xf] & 1U) == 0),local_268);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InvalidUseCasesForAllNotFuncsAndExclMarkOpTest::iterate()
{
	const glw::Functions& gl	 = m_context.getRenderContext().getFunctions();
	bool				  result = true;

	/* Create a vertex shader object */
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Execute all test iterations.. */
	for (int current_iteration = static_cast<int>(TEST_ITERATION_FIRST);
		 current_iteration < static_cast<int>(TEST_ITERATION_COUNT); ++current_iteration)
	{
		const std::string body			 = getShaderBody(static_cast<_test_iteration>(current_iteration));
		const char*		  body_raw_ptr   = body.c_str();
		glw::GLint		  compile_status = GL_FALSE;

		/* Assign the source code to the SO */
		gl.shaderSource(m_vs_id, 1,				 /* count */
						&body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		/* Try to compile the shader object. */
		gl.compileShader(m_vs_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(m_vs_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "The following vertex shader, used for test iteration ["
							   << getIterationName(static_cast<_test_iteration>(current_iteration))
							   << "] "
								  "was compiled successfully, even though it is invalid. Body:"
								  "\n>>\n"
							   << body << "\n<<\n"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all test iterations) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}